

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutVerifyCuts(If_Set_t *pCutSet,int fOrdered)

{
  If_Cut_t *pCut;
  If_Cut_t *pCut_00;
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  float *pfVar13;
  
  lVar2 = (long)pCutSet->nCuts;
  if (lVar2 < 1) {
    __assert_fail("pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                  ,0x43,"int If_CutVerifyCuts(If_Set_t *, int)");
  }
  lVar9 = 0;
  iVar4 = If_CutVerifyCuts::Count;
  do {
    pCut = pCutSet->ppCuts[lVar9];
    uVar3 = *(uint *)&pCut->field_0x1c;
    uVar11 = 0;
    if (0xffffff < uVar3) {
      uVar5 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 | 1 << (uint)(&pCut[1].Area)[uVar5] % 0x1f;
        uVar5 = uVar5 + 1;
      } while (uVar3 >> 0x18 != uVar5);
    }
    if (pCut->uSign != uVar11) {
      __assert_fail("pCut0->uSign == If_ObjCutSignCompute(pCut0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x47,"int If_CutVerifyCuts(If_Set_t *, int)");
    }
    if (fOrdered == 0) {
      if (0xffffff < uVar3) {
        uVar5 = (ulong)(uVar3 >> 0x18);
        pfVar13 = &pCut[1].Edge;
        uVar8 = 0;
        uVar12 = uVar5;
        do {
          uVar12 = uVar12 - 1;
          uVar7 = uVar8 + 1;
          if (uVar7 < uVar5) {
            uVar10 = 0;
            do {
              if ((&pCut[1].Area)[uVar8] == pfVar13[uVar10]) {
                __assert_fail("pCut0->pLeaves[m] != pCut0->pLeaves[n]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                              ,0x53,"int If_CutVerifyCuts(If_Set_t *, int)");
              }
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
          }
          pfVar13 = pfVar13 + 1;
          uVar8 = uVar7;
        } while (uVar7 != uVar5);
      }
    }
    else if (0x1ffffff < uVar3) {
      lVar6 = 0;
      do {
        if ((int)(&pCut[1].Edge)[lVar6] <= (int)(&pCut[1].Area)[lVar6]) {
          __assert_fail("pCut0->pLeaves[m-1] < pCut0->pLeaves[m]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x4c,"int If_CutVerifyCuts(If_Set_t *, int)");
        }
        lVar6 = lVar6 + 1;
      } while ((ulong)(uVar3 >> 0x18) - 1 != lVar6);
    }
    uVar5 = (ulong)(uVar3 >> 0x18);
    lVar6 = 0;
    do {
      pCut_00 = pCutSet->ppCuts[lVar6];
      if (pCut != pCut_00) {
        iVar4 = iVar4 + 1;
        uVar11 = *(uint *)&pCut_00->field_0x1c;
        If_CutVerifyCuts::Count = iVar4;
        if (uVar11 < 0x1000000) {
LAB_008c093b:
          uVar1 = 0;
          if (0xffffff < uVar3) {
            uVar12 = 0;
            uVar1 = 0;
            do {
              uVar1 = uVar1 | 1 << (uint)(&pCut[1].Area)[uVar12] % 0x1f;
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
          }
          if (pCut->uSign != uVar1) {
            __assert_fail("pCut0->uSign == If_ObjCutSignCompute(pCut0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                          ,0x61,"int If_CutVerifyCuts(If_Set_t *, int)");
          }
          uVar3 = 0;
          if (0xffffff < uVar11) {
            uVar5 = 0;
            uVar3 = 0;
            do {
              uVar3 = uVar3 | 1 << (uint)(&pCut_00[1].Area)[uVar5] % 0x1f;
              uVar5 = uVar5 + 1;
            } while (uVar11 >> 0x18 != uVar5);
          }
          if (pCut_00->uSign != uVar3) {
            __assert_fail("pCut1->uSign == If_ObjCutSignCompute(pCut1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                          ,0x62,"int If_CutVerifyCuts(If_Set_t *, int)");
          }
          If_CutPrint(pCut);
          If_CutPrint(pCut_00);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x65,"int If_CutVerifyCuts(If_Set_t *, int)");
        }
        uVar12 = 0;
        do {
          uVar8 = 0;
          if (0xffffff < uVar3) {
            uVar7 = 0;
            do {
              uVar8 = uVar7;
              if ((&pCut_00[1].Area)[uVar12] == (&pCut[1].Area)[uVar7]) break;
              uVar7 = uVar7 + 1;
              uVar8 = uVar5;
            } while (uVar5 != uVar7);
          }
          if ((uint)uVar8 == uVar3 >> 0x18) break;
          uVar12 = uVar12 + 1;
          if (uVar12 == uVar11 >> 0x18) goto LAB_008c093b;
        } while( true );
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
    lVar9 = lVar9 + 1;
    if (lVar9 == lVar2) {
      return 1;
    }
  } while( true );
}

Assistant:

int If_CutVerifyCuts( If_Set_t * pCutSet, int fOrdered )
{
    static int Count = 0;
    If_Cut_t * pCut0, * pCut1; 
    int i, k, m, n, Value;
    assert( pCutSet->nCuts > 0 );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pCut0 = pCutSet->ppCuts[i];
        assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
        if ( fOrdered )
        {
            // check duplicates
            for ( m = 1; m < (int)pCut0->nLeaves; m++ )
                assert( pCut0->pLeaves[m-1] < pCut0->pLeaves[m] );
        }
        else
        {
            // check duplicates
            for ( m = 0; m < (int)pCut0->nLeaves; m++ )
            for ( n = m+1; n < (int)pCut0->nLeaves; n++ )
            assert( pCut0->pLeaves[m] != pCut0->pLeaves[n] );
        }
        // check pairs
        for ( k = 0; k < pCutSet->nCuts; k++ )
        {
            pCut1 = pCutSet->ppCuts[k];
            if ( pCut0 == pCut1 )
                continue;
            Count++;
            // check containments
            Value = If_CutVerifyCut( pCut0, pCut1 );
//            assert( Value == 0 );
            if ( Value )
            {
                assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
                assert( pCut1->uSign == If_ObjCutSignCompute(pCut1) );
                If_CutPrint( pCut0 );
                If_CutPrint( pCut1 );
                assert( 0 );
            }
        }
    }
    return 1;
}